

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void solver2_logging_order_rec(sat_solver2 *s,int x)

{
  clause *pcVar1;
  int x_00;
  ulong uVar2;
  
  if (((uint)s->vi[x] & 0x20) == 0) {
    pcVar1 = Sat_MemClauseHand(&s->Mem,s->reasons[x]);
    for (uVar2 = 1; (uVar2 < (uint)*pcVar1 >> 0xb && (1 < (uint)pcVar1[uVar2 + 1]));
        uVar2 = uVar2 + 1) {
      x_00 = (int)pcVar1[uVar2 + 1] >> 1;
      if ((s->levels[x_00] != 0) && (((uint)s->vi[x_00] & 4) == 0)) {
        solver2_logging_order_rec(s,x_00);
      }
    }
    var_add_tag(s,x,8);
    veci_push(&s->min_step_order,x);
    return;
  }
  return;
}

Assistant:

static void solver2_logging_order_rec(sat_solver2* s, int x)
{
    clause* c;
    int i, y;
    if ( (var_tag(s,x) & 8) )
        return;
    c = clause2_read(s, var_reason(s,x));
    clause_foreach_var( c, y, i, 1 )
        if ( var_level(s,y) && (var_tag(s,y) & 1) == 0 )
            solver2_logging_order_rec(s, y);
    var_add_tag(s, x, 8);
    veci_push(&s->min_step_order, x);
}